

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

ENetListIterator enet_list_move(ENetListIterator position,void *dataFirst,void *dataLast)

{
  undefined8 *puVar1;
  _ENetListNode *p_Var2;
  ENetListIterator first;
  
  puVar1 = *(undefined8 **)((long)dataFirst + 8);
  *puVar1 = *dataLast;
  *(undefined8 **)(*dataLast + 8) = puVar1;
  p_Var2 = position->previous;
  *(_ENetListNode **)((long)dataFirst + 8) = p_Var2;
  *(ENetListIterator *)dataLast = position;
  p_Var2->next = (_ENetListNode *)dataFirst;
  position->previous = (_ENetListNode *)dataLast;
  return (ENetListIterator)dataFirst;
}

Assistant:

ENetListIterator enet_list_move(ENetListIterator position, void* dataFirst, void* dataLast) {
	ENetListIterator first = (ENetListIterator)dataFirst;
	ENetListIterator last = (ENetListIterator)dataLast;
	first->previous->next = last->next;
	last->next->previous = first->previous;
	first->previous = position->previous;
	last->next = position;
	first->previous->next = first;
	position->previous = last;

	return first;
}